

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O3

void __thiscall cppcms::url_dispatcher::assign(url_dispatcher *this,string *expr,handler1 *h,int p1)

{
  _data *p_Var1;
  pointer pcVar2;
  undefined1 *puVar3;
  option *this_00;
  regex arStack_a8 [8];
  value_type local_a0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  _Any_data local_50;
  code *local_40;
  
  p_Var1 = (this->d).ptr_;
  local_70 = local_60;
  pcVar2 = (expr->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + expr->_M_string_length);
  puVar3 = local_70;
  this_00 = (option *)operator_new(0xa0);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)local_90,puVar3,puVar3 + local_68);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_50,h);
  booster::regex::regex(arStack_a8,(string *)local_90,0);
  anon_unknown_0::option::option(this_00,arStack_a8);
  booster::regex::~regex(arStack_a8);
  this_00->_vptr_option = (_func_int **)&PTR__base_handler_00285f10;
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&this_00[1].match_.end_,
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)&local_50);
  *(int *)&this_00[1]._vptr_option = p1;
  *(undefined8 *)((long)&this_00[1]._vptr_option + 4) = 0;
  *(undefined8 *)&this_00[1].field_0xc = 0;
  *(undefined4 *)((long)&this_00[1].match_.begin_ + 4) = 0;
  local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00285f50;
  local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)this_00;
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  std::
  vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
  ::push_back(&p_Var1->options,&local_a0);
  if (local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.
               super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void url_dispatcher::assign(std::string const &expr,handler1 h,int p1)
	{
		d->options.push_back(make_handler(expr,h,p1));
	}